

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_core.cpp
# Opt level: O2

void r_exec::delegatedCoreWait(TimeJob *job)

{
  thread *this;
  int iVar1;
  State SVar2;
  int iVar3;
  _Mem *p_Var4;
  long lVar5;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  
  p_Var4 = (_Mem *)r_code::Mem::Get();
  _Mem::start_core(p_Var4);
  while( true ) {
    if (job->target_time != 0) {
      local_30.__d.__r =
           (duration)
           ((job->target_time - (long)delegatedCoreWait::last_lag.super___atomic_base<long>._M_i) *
           1000);
      std::this_thread::
      sleep_until<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                (&local_30);
    }
    iVar1 = (*(job->super__Object)._vptr__Object[3])(job);
    if ((char)iVar1 == '\0') break;
    p_Var4 = (_Mem *)r_code::Mem::Get();
    SVar2 = _Mem::check_state(p_Var4);
    if (SVar2 != RUNNING) break;
    if (job->target_time == 0) {
      lVar5 = 0;
    }
    else {
      lVar5 = (*Now)();
      lVar5 = lVar5 - job->target_time;
    }
    iVar1 = (*(job->super__Object)._vptr__Object[2])(job);
    (*(job->super__Object)._vptr__Object[5])(job,lVar5);
    delegatedCoreWait::last_lag.super___atomic_base<long>._M_i =
         (__atomic_base<long>)
         (long)((double)(long)delegatedCoreWait::last_lag.super___atomic_base<long>._M_i *
                0.8999999985098839 + (double)((float)lVar5 * 0.1));
    LOCK();
    UNLOCK();
    iVar3 = (*(job->super__Object)._vptr__Object[4])(job);
    if (((char)iVar1 == '\0') || ((char)iVar3 == '\0')) break;
  }
  this = job->thread;
  if (this != (thread *)0x0) {
    std::thread::~thread(this);
  }
  operator_delete(this);
  (*(job->super__Object)._vptr__Object[1])(job);
  p_Var4 = (_Mem *)r_code::Mem::Get();
  _Mem::shutdown_core(p_Var4);
  return;
}

Assistant:

void delegatedCoreWait(TimeJob *job)
{
    _Mem::Get()->start_core();
    bool run = true;

    static std::atomic_int64_t last_lag;

    static constexpr float smoothing_factor = 0.1;

    do {
        if (job->target_time > 0) {
            std::this_thread::sleep_until(high_resolution_clock::time_point(microseconds(job->target_time - last_lag)));
        }

        if (R_UNLIKELY(!job->is_alive())) {
            break;
        }

        if (R_UNLIKELY(_Mem::Get()->check_state() != _Mem::RUNNING)) {
            break;
        }

        int64_t lag = job->target_time ? Now() - job->target_time : 0;
        run = job->update();

        job->report(lag);

        last_lag = smoothing_factor * lag + (1.0 - smoothing_factor) * last_lag;
    } while(job->shouldRunAgain() && run);

    delete job->thread;
    delete job;
    _Mem::Get()->shutdown_core();
}